

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executor.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  int iVar1;
  __pid_t _Var2;
  size_t sVar3;
  SocketAcceptor *this;
  long *plVar4;
  char *pcVar5;
  ostream *poVar6;
  int extraout_EDX;
  SocketAcceptor *__stat_loc;
  string file;
  Application application;
  SessionSettings settings;
  ScreenLogFactory logFactory;
  FileStoreFactory storeFactory;
  long *local_308 [2];
  long local_2f8 [2];
  Application local_2e8;
  undefined **local_2e0;
  undefined **local_2d8;
  undefined **local_2d0;
  undefined **local_2c8;
  undefined **local_2c0;
  undefined **local_2b8;
  undefined **local_2b0;
  undefined **local_2a8;
  undefined **local_2a0;
  undefined8 local_298;
  SessionSettings local_290;
  undefined1 local_200 [104];
  _Alloc_hider local_198;
  char local_188 [16];
  bool local_178;
  undefined *local_170 [2];
  _Rb_tree<FIX::SessionID,_std::pair<const_FIX::SessionID,_FIX::Dictionary>,_std::_Select1st<std::pair<const_FIX::SessionID,_FIX::Dictionary>_>,_std::less<FIX::SessionID>,_std::allocator<std::pair<const_FIX::SessionID,_FIX::Dictionary>_>_>
  local_160;
  Dictionary local_130;
  allocator<char> local_d0 [184];
  
  if (argc < 2) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"usage: ",7);
    pcVar5 = *argv;
    if (pcVar5 == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x160128);
    }
    else {
      sVar3 = strlen(pcVar5);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar5,sVar3);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," FILE.",6);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '(');
    std::ostream::put('(');
    std::ostream::flush();
    iVar1 = 0;
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>((string *)local_308,argv[1],local_d0);
    FIX::SessionSettings::SessionSettings(&local_290,(string *)local_308,false);
    local_2e8._vptr_Application = (_func_int **)&PTR__Application_00156728;
    local_2e0 = &PTR__Application_001567b0;
    local_2d8 = &PTR__Application_00156990;
    local_2d0 = &PTR__Application_00156b80;
    local_2c8 = &PTR__Application_00156e90;
    local_2c0 = &PTR__Application_00157300;
    local_2b8 = &PTR__Application_00157900;
    local_2b0 = &PTR__Application_00157f00;
    local_2a8 = &PTR__Application_001585c0;
    local_2a0 = &PTR__Application_00158fb0;
    local_298 = 0;
    FIX::FileStoreFactory::FileStoreFactory((FileStoreFactory *)local_d0,&local_290);
    std::
    _Rb_tree<FIX::SessionID,_std::pair<const_FIX::SessionID,_FIX::Dictionary>,_std::_Select1st<std::pair<const_FIX::SessionID,_FIX::Dictionary>_>,_std::less<FIX::SessionID>,_std::allocator<std::pair<const_FIX::SessionID,_FIX::Dictionary>_>_>
    ::_Rb_tree((_Rb_tree<FIX::SessionID,_std::pair<const_FIX::SessionID,_FIX::Dictionary>,_std::_Select1st<std::pair<const_FIX::SessionID,_FIX::Dictionary>_>,_std::less<FIX::SessionID>,_std::allocator<std::pair<const_FIX::SessionID,_FIX::Dictionary>_>_>
                *)local_200,
               (_Rb_tree<FIX::SessionID,_std::pair<const_FIX::SessionID,_FIX::Dictionary>,_std::_Select1st<std::pair<const_FIX::SessionID,_FIX::Dictionary>_>,_std::less<FIX::SessionID>,_std::allocator<std::pair<const_FIX::SessionID,_FIX::Dictionary>_>_>
                *)&local_290);
    local_200._48_8_ = &PTR__Dictionary_0015ed68;
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)(local_200 + 0x38),&local_290.m_defaults.m_data._M_t);
    local_198._M_p = local_188;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_198,local_290.m_defaults.m_name._M_dataplus._M_p,
               local_290.m_defaults.m_name._M_dataplus._M_p +
               local_290.m_defaults.m_name._M_string_length);
    local_178 = local_290.m_resolveEnvVars;
    FIX::ScreenLogFactory::ScreenLogFactory
              ((ScreenLogFactory *)local_170,(SessionSettings *)local_200);
    FIX::Dictionary::~Dictionary((Dictionary *)(local_200 + 0x30));
    std::
    _Rb_tree<FIX::SessionID,_std::pair<const_FIX::SessionID,_FIX::Dictionary>,_std::_Select1st<std::pair<const_FIX::SessionID,_FIX::Dictionary>_>,_std::less<FIX::SessionID>,_std::allocator<std::pair<const_FIX::SessionID,_FIX::Dictionary>_>_>
    ::~_Rb_tree((_Rb_tree<FIX::SessionID,_std::pair<const_FIX::SessionID,_FIX::Dictionary>,_std::_Select1st<std::pair<const_FIX::SessionID,_FIX::Dictionary>_>,_std::less<FIX::SessionID>,_std::allocator<std::pair<const_FIX::SessionID,_FIX::Dictionary>_>_>
                 *)local_200);
    this = (SocketAcceptor *)operator_new(0x1d0);
    FIX::SocketAcceptor::SocketAcceptor
              (this,&local_2e8,(MessageStoreFactory *)local_d0,&local_290,(LogFactory *)local_170);
    __stat_loc = this;
    FIX::Acceptor::start();
    _Var2 = wait(__stat_loc);
    if (this != (SocketAcceptor *)0x0) {
      (**(code **)(*(long *)this + 8))(this);
    }
    local_170[0] = &FIX::Message::typeinfo;
    FIX::Dictionary::~Dictionary(&local_130);
    std::
    _Rb_tree<FIX::SessionID,_std::pair<const_FIX::SessionID,_FIX::Dictionary>,_std::_Select1st<std::pair<const_FIX::SessionID,_FIX::Dictionary>_>,_std::less<FIX::SessionID>,_std::allocator<std::pair<const_FIX::SessionID,_FIX::Dictionary>_>_>
    ::~_Rb_tree(&local_160);
    FIX::FileStoreFactory::~FileStoreFactory((FileStoreFactory *)local_d0);
    FIX::Dictionary::~Dictionary(&local_290.m_defaults);
    std::
    _Rb_tree<FIX::SessionID,_std::pair<const_FIX::SessionID,_FIX::Dictionary>,_std::_Select1st<std::pair<const_FIX::SessionID,_FIX::Dictionary>_>,_std::less<FIX::SessionID>,_std::allocator<std::pair<const_FIX::SessionID,_FIX::Dictionary>_>_>
    ::~_Rb_tree((_Rb_tree<FIX::SessionID,_std::pair<const_FIX::SessionID,_FIX::Dictionary>,_std::_Select1st<std::pair<const_FIX::SessionID,_FIX::Dictionary>_>,_std::less<FIX::SessionID>,_std::allocator<std::pair<const_FIX::SessionID,_FIX::Dictionary>_>_>
                 *)&local_290);
    if (extraout_EDX != 1) {
      if (local_308[0] != local_2f8) {
        operator_delete(local_308[0],local_2f8[0] + 1);
      }
      _Unwind_Resume(_Var2);
    }
    plVar4 = (long *)__cxa_begin_catch(_Var2);
    pcVar5 = (char *)(**(code **)(*plVar4 + 0x10))(plVar4);
    poVar6 = std::operator<<((ostream *)&std::cout,pcVar5);
    std::endl<char,std::char_traits<char>>(poVar6);
    __cxa_end_catch();
    if (local_308[0] != local_2f8) {
      operator_delete(local_308[0],local_2f8[0] + 1);
    }
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

int main(int argc, char **argv) {
  if (argc < 2) {
    std::cout << "usage: " << argv[0] << " FILE." << std::endl;
    return 0;
  }
  std::string file = argv[1];
#ifdef HAVE_SSL
  std::string isSSL;
  if (argc > 2) {
    isSSL.assign(argv[2]);
  }
#endif

  try {
    FIX::SessionSettings settings(file);

    Application application;
    FIX::FileStoreFactory storeFactory(settings);
    FIX::ScreenLogFactory logFactory(settings);

    std::unique_ptr<FIX::Acceptor> acceptor;
#ifdef HAVE_SSL
    if (isSSL.compare("SSL") == 0) {
      acceptor = std::unique_ptr<FIX::Acceptor>(
          new FIX::ThreadedSSLSocketAcceptor(application, storeFactory, settings, logFactory));
    } else if (isSSL.compare("SSL-ST") == 0) {
      acceptor
          = std::unique_ptr<FIX::Acceptor>(new FIX::SSLSocketAcceptor(application, storeFactory, settings, logFactory));
    } else
#endif
      acceptor
          = std::unique_ptr<FIX::Acceptor>(new FIX::SocketAcceptor(application, storeFactory, settings, logFactory));

    acceptor->start();
    wait();
    acceptor->stop();

    return 0;
  } catch (std::exception &e) {
    std::cout << e.what() << std::endl;
    return 1;
  }
}